

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O3

ProStringList * __thiscall
ProjectBuilderMakefileGenerator::fixListForOutput
          (ProStringList *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,
          ProStringList *l)

{
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  QString local_98;
  QString local_80;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  if ((l->super_QList<ProString>).d.size != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      ProString::toQString
                (&local_98,
                 (ProString *)((long)&(((l->super_QList<ProString>).d.ptr)->m_string).d.d + lVar2));
      fixForOutput(&local_80,this,&local_98);
      ProString::ProString(&local_68,&local_80);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super_QList<ProString>).d.size,&local_68);
      QList<ProString>::end(&__return_storage_ptr__->super_QList<ProString>);
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x30;
    } while (uVar1 < (ulong)(l->super_QList<ProString>).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList
ProjectBuilderMakefileGenerator::fixListForOutput(const ProStringList &l)
{
    ProStringList ret;
    for(int i = 0; i < l.size(); i++)
        ret += fixForOutput(l[i].toQString());
    return ret;
}